

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O1

void __thiscall
CoreML::TreeEnsembleClassifier::TreeEnsembleClassifier
          (TreeEnsembleClassifier *this,string *predictedClassOutputName,
          string *classProbabilityOutputName,string *description)

{
  Model *this_00;
  element_type *peVar1;
  string *psVar2;
  TreeEnsembleClassifier *this_01;
  ModelDescription *pMVar3;
  Model local_40;
  
  Model::Model(&local_40,description);
  TreeEnsembleBase::TreeEnsembleBase(&this->super_TreeEnsembleBase,&local_40,true);
  Model::~Model(&local_40);
  (this->super_TreeEnsembleBase).super_Model._vptr_Model =
       (_func_int **)&PTR__TreeEnsembleRegressor_003dc4e8;
  this_00 = (this->super_TreeEnsembleBase).super_Model.m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] != 0x192) {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 0x192;
    this_01 = (TreeEnsembleClassifier *)operator_new(0x30);
    Specification::TreeEnsembleClassifier::TreeEnsembleClassifier(this_01);
    (this_00->Type_).treeensembleclassifier_ = this_01;
  }
  this->tree_classifier_parameters = (TreeEnsembleClassifier *)this_00->Type_;
  peVar1 = (this->super_TreeEnsembleBase).super_Model.m_spec.
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    Specification::ModelDescription::ModelDescription(pMVar3);
    peVar1->description_ = pMVar3;
  }
  psVar2 = (peVar1->description_->predictedfeaturename_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&peVar1->description_->predictedfeaturename_,predictedClassOutputName);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  peVar1 = (this->super_TreeEnsembleBase).super_Model.m_spec.
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    Specification::ModelDescription::ModelDescription(pMVar3);
    peVar1->description_ = pMVar3;
  }
  psVar2 = (peVar1->description_->predictedprobabilitiesname_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&peVar1->description_->predictedprobabilitiesname_,classProbabilityOutputName);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  return;
}

Assistant:

TreeEnsembleClassifier::TreeEnsembleClassifier
    (const std::string& predictedClassOutputName,
     const std::string& classProbabilityOutputName,
     const std::string& description)
    : TreeEnsembleBase(Model(description), true /* isClassifier */),
      tree_classifier_parameters(m_spec->mutable_treeensembleclassifier())
    {
        m_spec->mutable_description()->set_predictedfeaturename(predictedClassOutputName);
        m_spec->mutable_description()->set_predictedprobabilitiesname(classProbabilityOutputName);
    }